

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QHeaderViewPrivate::SectionItem>::copyAppend
          (QPodArrayOps<QHeaderViewPrivate::SectionItem> *this,qsizetype n,parameter_type t)

{
  SectionItem *pSVar1;
  SectionItem *in_RDX;
  long in_RSI;
  long in_RDI;
  SectionItem *where;
  QArrayDataPointer<QHeaderViewPrivate::SectionItem> *in_stack_ffffffffffffffe0;
  long local_10;
  
  if (in_RSI != 0) {
    pSVar1 = QArrayDataPointer<QHeaderViewPrivate::SectionItem>::end(in_stack_ffffffffffffffe0);
    *(long *)(in_RDI + 0x10) = in_RSI + *(long *)(in_RDI + 0x10);
    local_10 = in_RSI;
    while (local_10 != 0) {
      *pSVar1 = *in_RDX;
      pSVar1 = pSVar1 + 1;
      local_10 = local_10 + -1;
    }
  }
  return;
}

Assistant:

void copyAppend(qsizetype n, parameter_type t) noexcept
    {
        Q_ASSERT(!this->isShared() || n == 0);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        if (!n)
            return;

        T *where = this->end();
        this->size += qsizetype(n);
        while (n--)
            *where++ = t;
    }